

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitset.h
# Opt level: O2

int bitset_container_get_index(bitset_container_t *container,uint16_t x)

{
  ulong uVar1;
  int iVar2;
  ulong uVar3;
  undefined6 in_register_00000032;
  ulong uVar4;
  ulong uVar5;
  
  uVar4 = CONCAT62(in_register_00000032,x) >> 6 & 0x3ffffff;
  uVar1 = container->words[uVar4];
  if ((uVar1 >> ((ulong)x & 0x3f) & 1) != 0) {
    iVar2 = 0;
    for (uVar3 = 0; uVar4 != uVar3; uVar3 = uVar3 + 1) {
      uVar5 = container->words[uVar3];
      uVar5 = uVar5 - (uVar5 >> 1 & 0x5555555555555555);
      uVar5 = (uVar5 >> 2 & 0x3333333333333333) + (uVar5 & 0x3333333333333333);
      iVar2 = iVar2 + (uint)(byte)(((uVar5 >> 4) + uVar5 & 0xf0f0f0f0f0f0f0f) * 0x101010101010101 >>
                                  0x38);
    }
    uVar1 = uVar1 & (2L << ((byte)x & 0x3f)) - 1U;
    uVar1 = uVar1 - (uVar1 >> 1 & 0x5555555555555555);
    uVar1 = (uVar1 >> 2 & 0x3333333333333333) + (uVar1 & 0x3333333333333333);
    return iVar2 + (uint)(byte)(((uVar1 >> 4) + uVar1 & 0xf0f0f0f0f0f0f0f) * 0x101010101010101 >>
                               0x38) + -1;
  }
  return -1;
}

Assistant:

inline bool bitset_container_get(const bitset_container_t *bitset,
                                 uint16_t pos) {
    const uint64_t word = bitset->words[pos >> 6];
    return (word >> (pos & 63)) & 1;
}